

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  float fVar1;
  uint uVar2;
  pointer pfVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  Logger *this_00;
  long *plVar12;
  LWOImporter *pLVar13;
  uint *puVar14;
  uint uVar15;
  long *plVar16;
  Layer *pLVar17;
  Layer *extraout_RDX;
  Layer *extraout_RDX_00;
  Layer *extraout_RDX_01;
  Layer *extraout_RDX_02;
  Layer *extraout_RDX_03;
  Layer *extraout_RDX_04;
  ulong uVar18;
  uint next;
  LWOImporter *pLVar19;
  uint uVar20;
  LWOImporter *this_01;
  pointer pFVar21;
  pointer pUVar22;
  UVChannel *uv;
  ulong local_d8;
  int local_cc;
  long *local_b0;
  long local_a0;
  long lStack_98;
  TextureList *local_90;
  TextureList *local_88;
  TextureList *local_80;
  TextureList *local_78;
  TextureList *local_70;
  TextureList *local_68;
  TextureList *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar22 = (layer->mUVChannels).
            super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((layer->mUVChannels).
      super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
      super__Vector_impl_data._M_finish == pUVar22) {
    this_01 = (LWOImporter *)0x0;
  }
  else {
    local_68 = &surf->mColorTextures;
    local_70 = &surf->mDiffuseTextures;
    local_78 = &surf->mSpecularTextures;
    local_80 = &surf->mGlossinessTextures;
    local_88 = &surf->mOpacityTextures;
    local_90 = &surf->mBumpTextures;
    local_60 = &surf->mReflectionTextures;
    local_d8 = 0;
    next = 0;
    local_cc = 0;
    this_01 = (LWOImporter *)0x0;
    do {
      puVar14 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = (uint)local_d8;
      if (puVar14 !=
          (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        uv = pUVar22 + local_d8;
        local_58 = &(uv->super_VMapEntry).name;
        do {
          pFVar21 = (layer->mFaces).
                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pFVar21[*puVar14].super_aiFace.mNumIndices != 0) {
            pFVar21 = pFVar21 + *puVar14;
            uVar18 = 0;
            do {
              uVar20 = (pFVar21->super_aiFace).mIndices[uVar18];
              pLVar17 = (Layer *)(ulong)uVar20;
              bVar4 = true;
              if (((uv->super_VMapEntry).abAssigned.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [uVar20 >> 6] >> ((ulong)pLVar17 & 0x3f) & 1) != 0) {
                pfVar3 = (uv->super_VMapEntry).rawData.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                fVar1 = pfVar3[(long)pLVar17 * 2];
                if ((((fVar1 != 0.0) || (NAN(fVar1))) ||
                    (fVar1 = pfVar3[(long)pLVar17 * 2 + 1], fVar1 != 0.0)) || (NAN(fVar1))) {
                  uVar20 = (uint)this_01;
                  if (uVar20 < 8) {
                    pLVar13 = this_01;
                    cVar5 = FindUVChannels(this_01,local_68,pLVar17,uv,next);
                    cVar6 = FindUVChannels(pLVar13,local_70,extraout_RDX,uv,next);
                    cVar7 = FindUVChannels(pLVar13,local_78,extraout_RDX_00,uv,next);
                    cVar8 = FindUVChannels(pLVar13,local_80,extraout_RDX_01,uv,next);
                    cVar9 = FindUVChannels(pLVar13,local_88,extraout_RDX_02,uv,next);
                    cVar10 = FindUVChannels(pLVar13,local_90,extraout_RDX_03,uv,next);
                    cVar11 = FindUVChannels(pLVar13,local_60,extraout_RDX_04,uv,next);
                    if (cVar11 == '\0' &&
                        ((cVar10 == '\0' && cVar9 == '\0') &&
                        ((cVar8 == '\0' && cVar7 == '\0') && (cVar6 == '\0' && cVar5 == '\0')))) {
                      out[(long)this_01] = uVar15;
                      local_cc = local_cc + 1;
                      this_01 = (LWOImporter *)(ulong)(uVar20 + 1);
                    }
                    else {
                      pLVar13 = (LWOImporter *)(ulong)next;
                      if ((local_cc != 0) && (next < uVar20)) {
                        uVar2 = out[(long)pLVar13];
                        pLVar19 = pLVar13;
                        do {
                          out[(long)((long)&(pLVar19->super_BaseImporter)._vptr_BaseImporter + 1)] =
                               uVar2;
                          pLVar19 = (LWOImporter *)
                                    ((long)&(pLVar19->super_BaseImporter)._vptr_BaseImporter + 1);
                        } while (this_01 != pLVar19);
                      }
                      next = next + 1;
                      out[(long)pLVar13] = uVar15;
                      this_01 = (LWOImporter *)(ulong)(uVar20 + 1);
                    }
                  }
                  else {
                    this_00 = DefaultLogger::get();
                    std::operator+(&local_50,
                                   "LWO: Maximum number of UV channels for this mesh reached. Skipping channel \'"
                                   ,local_58);
                    plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_b0 = &local_a0;
                    plVar16 = plVar12 + 2;
                    if ((long *)*plVar12 == plVar16) {
                      local_a0 = *plVar16;
                      lStack_98 = plVar12[3];
                    }
                    else {
                      local_a0 = *plVar16;
                      local_b0 = (long *)*plVar12;
                    }
                    *plVar12 = (long)plVar16;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    Logger::error(this_00,(char *)local_b0);
                    if (local_b0 != &local_a0) {
                      operator_delete(local_b0);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p);
                    }
                  }
                  puVar14 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1;
                  bVar4 = false;
                }
              }
            } while ((bVar4) && (uVar18 = uVar18 + 1, uVar18 < (pFVar21->super_aiFace).mNumIndices))
            ;
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 !=
                 (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      local_d8 = (ulong)(uVar15 + 1);
      pUVar22 = (layer->mUVChannels).
                super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = ((long)(layer->mUVChannels).
                      super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar22 >> 4) *
               0x6db6db6db6db6db7;
    } while (local_d8 <= uVar18 && uVar18 - local_d8 != 0);
  }
  if ((uint)this_01 < 8) {
    out[(long)this_01] = 0xffffffff;
  }
  return;
}

Assistant:

void LWOImporter::FindUVChannels(LWO::Surface& surf,
    LWO::SortedRep& sorted,LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_TEXTURECOORDS])
{
    unsigned int next = 0, extra = 0, num_extra = 0;

    // Check whether we have an UV entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mUVChannels.size();++i)  {
        LWO::UVChannel& uv = layer.mUVChannels[i];

        for (LWO::SortedRep::const_iterator it = sorted.begin(); it != sorted.end(); ++it)  {

            LWO::Face& face = layer.mFaces[*it];

            for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                unsigned int idx = face.mIndices[n];

                if (uv.abAssigned[idx] && ((aiVector2D*)&uv.rawData[0])[idx] != aiVector2D()) {

                    if (extra >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {

                        ASSIMP_LOG_ERROR("LWO: Maximum number of UV channels for "
                            "this mesh reached. Skipping channel \'" + uv.name + "\'");

                    }
                    else {
                        // Search through all textures assigned to 'surf' and look for this UV channel
                        char had = 0;
                        had |= FindUVChannels(surf.mColorTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mDiffuseTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mSpecularTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mGlossinessTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mOpacityTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mBumpTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mReflectionTextures,layer,uv,next);

                        // We have a texture referencing this UV channel so we have to take special care
                        // and are willing to drop unreferenced channels in favour of it.
                        if (had != 0) {
                            if (num_extra) {

                                for (unsigned int a = next; a < std::min( extra, AI_MAX_NUMBER_OF_TEXTURECOORDS-1u ); ++a) {
                                    out[a+1] = out[a];
                                }
                            }
                            ++extra;
                            out[next++] = i;
                        }
                        // Bah ... seems not to be used at all. Push to end if enough space is available.
                        else {
                            out[extra++] = i;
                            ++num_extra;
                        }
                    }
                    it = sorted.end()-1;
                    break;
                }
            }
        }
    }
    if (extra < AI_MAX_NUMBER_OF_TEXTURECOORDS) {
        out[extra] = UINT_MAX;
    }
}